

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCut.c
# Opt level: O0

int Ivy_ManFindBoolCut_rec
              (Ivy_Man_t *p,Ivy_Obj_t *pObj,Vec_Ptr_t *vLeaves,Vec_Ptr_t *vVolume,Ivy_Obj_t *pPivot)

{
  int iVar1;
  int iVar2;
  Ivy_Obj_t *pIVar3;
  int RetValue1;
  int RetValue0;
  Ivy_Obj_t *pPivot_local;
  Vec_Ptr_t *vVolume_local;
  Vec_Ptr_t *vLeaves_local;
  Ivy_Obj_t *pObj_local;
  Ivy_Man_t *p_local;
  
  if (pObj == pPivot) {
    Vec_PtrPushUnique(vLeaves,pObj);
    Vec_PtrPushUnique(vVolume,pObj);
    p_local._4_4_ = 1;
  }
  else if ((*(uint *)&pObj->field_0x8 >> 4 & 1) == 0) {
    iVar1 = Ivy_ObjIsCi(pObj);
    if (iVar1 == 0) {
      iVar1 = Ivy_ObjIsBuf(pObj);
      if (iVar1 == 0) {
        iVar1 = Ivy_ObjIsNode(pObj);
        if (iVar1 == 0) {
          __assert_fail("Ivy_ObjIsNode(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyCut.c"
                        ,0xf5,
                        "int Ivy_ManFindBoolCut_rec(Ivy_Man_t *, Ivy_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Ivy_Obj_t *)"
                       );
        }
        pIVar3 = Ivy_ObjFanin0(pObj);
        iVar1 = Ivy_ManFindBoolCut_rec(p,pIVar3,vLeaves,vVolume,pPivot);
        pIVar3 = Ivy_ObjFanin1(pObj);
        iVar2 = Ivy_ManFindBoolCut_rec(p,pIVar3,vLeaves,vVolume,pPivot);
        if ((iVar1 == 0) && (iVar2 == 0)) {
          p_local._4_4_ = 0;
        }
        else {
          if (iVar1 == 0) {
            pIVar3 = Ivy_ObjFanin0(pObj);
            Vec_PtrPushUnique(vLeaves,pIVar3);
            pIVar3 = Ivy_ObjFanin0(pObj);
            Vec_PtrPushUnique(vVolume,pIVar3);
          }
          if (iVar2 == 0) {
            pIVar3 = Ivy_ObjFanin1(pObj);
            Vec_PtrPushUnique(vLeaves,pIVar3);
            pIVar3 = Ivy_ObjFanin1(pObj);
            Vec_PtrPushUnique(vVolume,pIVar3);
          }
          Vec_PtrPushUnique(vVolume,pObj);
          p_local._4_4_ = 1;
        }
      }
      else {
        pIVar3 = Ivy_ObjFanin0(pObj);
        iVar1 = Ivy_ManFindBoolCut_rec(p,pIVar3,vLeaves,vVolume,pPivot);
        if (iVar1 == 0) {
          p_local._4_4_ = 0;
        }
        else {
          Vec_PtrPushUnique(vVolume,pObj);
          p_local._4_4_ = 1;
        }
      }
    }
    else {
      p_local._4_4_ = 0;
    }
  }
  else {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int Ivy_ManFindBoolCut_rec( Ivy_Man_t * p, Ivy_Obj_t * pObj, Vec_Ptr_t * vLeaves, Vec_Ptr_t * vVolume, Ivy_Obj_t * pPivot )
{
    int RetValue0, RetValue1;
    if ( pObj == pPivot )
    {
        Vec_PtrPushUnique( vLeaves, pObj );
        Vec_PtrPushUnique( vVolume, pObj );
        return 1;        
    }
    if ( pObj->fMarkA )
        return 0;

//    assert( !Ivy_ObjIsCi(pObj) );
    if ( Ivy_ObjIsCi(pObj) )
        return 0;

    if ( Ivy_ObjIsBuf(pObj) )
    {
        RetValue0 = Ivy_ManFindBoolCut_rec( p, Ivy_ObjFanin0(pObj), vLeaves, vVolume, pPivot );
        if ( !RetValue0 )
            return 0;
        Vec_PtrPushUnique( vVolume, pObj );
        return 1;
    }
    assert( Ivy_ObjIsNode(pObj) );
    RetValue0 = Ivy_ManFindBoolCut_rec( p, Ivy_ObjFanin0(pObj), vLeaves, vVolume, pPivot );
    RetValue1 = Ivy_ManFindBoolCut_rec( p, Ivy_ObjFanin1(pObj), vLeaves, vVolume, pPivot );
    if ( !RetValue0 && !RetValue1 )
        return 0;
    // add new leaves
    if ( !RetValue0 )
    {
        Vec_PtrPushUnique( vLeaves, Ivy_ObjFanin0(pObj) );
        Vec_PtrPushUnique( vVolume, Ivy_ObjFanin0(pObj) );
    }
    if ( !RetValue1 )
    {
        Vec_PtrPushUnique( vLeaves, Ivy_ObjFanin1(pObj) );
        Vec_PtrPushUnique( vVolume, Ivy_ObjFanin1(pObj) );
    }
    Vec_PtrPushUnique( vVolume, pObj );
    return 1;
}